

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::PsbtGlobalXpub,_cfd::js::api::PsbtGlobalXpubStruct>
::ConvertFromStruct(JsonObjectVector<cfd::js::api::json::PsbtGlobalXpub,_cfd::js::api::PsbtGlobalXpubStruct>
                    *this,vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>
                          *list)

{
  bool bVar1;
  undefined1 local_148 [8];
  PsbtGlobalXpub object;
  PsbtGlobalXpubStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>
  *__range3;
  vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>
  *list_local;
  JsonObjectVector<cfd::js::api::json::PsbtGlobalXpub,_cfd::js::api::PsbtGlobalXpubStruct>
  *this_local;
  
  __end0 = std::
           vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>
           ::begin(list);
  element = (PsbtGlobalXpubStruct *)
            std::
            vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>
            ::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cfd::js::api::PsbtGlobalXpubStruct_*,_std::vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>_>
                                *)&element);
    if (!bVar1) break;
    object._264_8_ =
         __gnu_cxx::
         __normal_iterator<const_cfd::js::api::PsbtGlobalXpubStruct_*,_std::vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>_>
         ::operator*(&__end0);
    js::api::json::PsbtGlobalXpub::PsbtGlobalXpub((PsbtGlobalXpub *)local_148);
    js::api::json::PsbtGlobalXpub::ConvertFromStruct
              ((PsbtGlobalXpub *)local_148,(PsbtGlobalXpubStruct *)object._264_8_);
    std::
    vector<cfd::js::api::json::PsbtGlobalXpub,_std::allocator<cfd::js::api::json::PsbtGlobalXpub>_>
    ::push_back(&(this->super_JsonVector<cfd::js::api::json::PsbtGlobalXpub>).
                 super_vector<cfd::js::api::json::PsbtGlobalXpub,_std::allocator<cfd::js::api::json::PsbtGlobalXpub>_>
                ,(value_type *)local_148);
    js::api::json::PsbtGlobalXpub::~PsbtGlobalXpub((PsbtGlobalXpub *)local_148);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::PsbtGlobalXpubStruct_*,_std::vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }